

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void __thiscall ncnn::Mat::substract_mean_normalize(Mat *this,float *mean_vals,float *norm_vals)

{
  float fVar1;
  float fVar2;
  Layer *pLVar3;
  float *pfVar4;
  long in_RDX;
  long in_RSI;
  size_t i;
  long in_RDI;
  Option opt;
  int q_2;
  Mat weights_2 [2];
  ParamDict pd_2;
  int q_1;
  Mat weights_1 [1];
  ParamDict pd_1;
  int q;
  Mat weights [1];
  ParamDict pd;
  Layer *op;
  Mat *in_stack_ffffffffffffe0a8;
  Mat *in_stack_ffffffffffffe0b0;
  undefined4 in_stack_ffffffffffffe0b8;
  int in_stack_ffffffffffffe0bc;
  Mat *in_stack_ffffffffffffe0c0;
  Mat *local_1f28;
  ParamDict *in_stack_ffffffffffffe0f0;
  Mat *local_1ed0;
  Mat *local_1e98;
  Mat *local_1e50;
  Mat *local_1e18;
  Mat *local_1dd0;
  undefined1 local_1db8 [4];
  undefined4 local_1db4;
  undefined1 local_1d90 [20];
  int local_1d7c;
  Mat local_1cf8;
  Mat local_1cb8;
  undefined1 auStack_1c78 [2312];
  undefined1 local_1370 [20];
  int local_135c;
  Mat local_1318;
  undefined1 auStack_12d8 [2312];
  undefined1 local_9d0 [20];
  int local_9bc;
  Mat local_978;
  undefined1 auStack_938 [2328];
  Layer *local_20;
  long local_18;
  long local_10;
  
  local_10 = in_RSI;
  if ((in_RSI == 0) || (in_RDX != 0)) {
    local_18 = in_RDX;
    if ((in_RSI == 0) && (in_RDX != 0)) {
      local_20 = create_layer(in_stack_ffffffffffffe0bc);
      ParamDict::ParamDict(in_stack_ffffffffffffe0f0);
      ParamDict::set((ParamDict *)(auStack_12d8 + 8),0,*(int *)(in_RDI + 0x34));
      (*local_20->_vptr_Layer[2])(local_20,auStack_12d8 + 8);
      local_1e50 = &local_1318;
      do {
        Mat(local_1e50);
        local_1e50 = local_1e50 + 1;
      } while (local_1e50 != (Mat *)auStack_12d8);
      Mat(in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0bc,(size_t)in_stack_ffffffffffffe0b0,
          (Allocator *)in_stack_ffffffffffffe0a8);
      operator=((Mat *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8),
                in_stack_ffffffffffffe0b0);
      ~Mat((Mat *)0x11abba);
      for (local_135c = 0; pLVar3 = local_20, local_135c < *(int *)(in_RDI + 0x34);
          local_135c = local_135c + 1) {
        fVar1 = *(float *)(local_18 + (long)local_135c * 4);
        pfVar4 = operator[](&local_1318,(long)local_135c);
        *pfVar4 = fVar1;
      }
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)in_stack_ffffffffffffe0b0,in_stack_ffffffffffffe0a8);
      (*pLVar3->_vptr_Layer[3])(pLVar3,local_1370);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)0x11ad4b);
      local_1e98 = (Mat *)auStack_12d8;
      do {
        local_1e98 = local_1e98 + -1;
        ~Mat((Mat *)0x11ad80);
      } while (local_1e98 != &local_1318);
      ParamDict::~ParamDict((ParamDict *)in_stack_ffffffffffffe0c0);
    }
    else {
      if (in_RSI == 0) {
        return;
      }
      if (in_RDX == 0) {
        return;
      }
      local_20 = create_layer(in_stack_ffffffffffffe0bc);
      ParamDict::ParamDict(in_stack_ffffffffffffe0f0);
      ParamDict::set((ParamDict *)(auStack_1c78 + 8),0,*(int *)(in_RDI + 0x34));
      ParamDict::set((ParamDict *)(auStack_1c78 + 8),1,1);
      (*local_20->_vptr_Layer[2])(local_20,auStack_1c78 + 8);
      local_1ed0 = &local_1cf8;
      do {
        Mat(local_1ed0);
        local_1ed0 = local_1ed0 + 1;
      } while (local_1ed0 != (Mat *)auStack_1c78);
      Mat(in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0bc,(size_t)in_stack_ffffffffffffe0b0,
          (Allocator *)in_stack_ffffffffffffe0a8);
      operator=((Mat *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8),
                in_stack_ffffffffffffe0b0);
      ~Mat((Mat *)0x11af68);
      Mat(in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0bc,(size_t)in_stack_ffffffffffffe0b0,
          (Allocator *)in_stack_ffffffffffffe0a8);
      operator=((Mat *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8),
                in_stack_ffffffffffffe0b0);
      ~Mat((Mat *)0x11afaf);
      for (local_1d7c = 0; pLVar3 = local_20, local_1d7c < *(int *)(in_RDI + 0x34);
          local_1d7c = local_1d7c + 1) {
        fVar1 = *(float *)(local_18 + (long)local_1d7c * 4);
        pfVar4 = operator[](&local_1cf8,(long)local_1d7c);
        *pfVar4 = fVar1;
        i = (size_t)local_1d7c;
        fVar1 = *(float *)(local_10 + i * 4);
        fVar2 = *(float *)(local_18 + i * 4);
        pfVar4 = operator[](&local_1cb8,i);
        *pfVar4 = -fVar1 * fVar2;
      }
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)in_stack_ffffffffffffe0b0,in_stack_ffffffffffffe0a8);
      (*pLVar3->_vptr_Layer[3])(pLVar3,local_1d90);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)0x11b199);
      local_1f28 = (Mat *)auStack_1c78;
      do {
        local_1f28 = local_1f28 + -1;
        ~Mat((Mat *)0x11b1c4);
      } while (local_1f28 != &local_1cf8);
      ParamDict::~ParamDict((ParamDict *)in_stack_ffffffffffffe0c0);
    }
  }
  else {
    local_20 = create_layer(in_stack_ffffffffffffe0bc);
    ParamDict::ParamDict(in_stack_ffffffffffffe0f0);
    ParamDict::set((ParamDict *)(auStack_938 + 0x18),0,*(int *)(in_RDI + 0x34));
    (*local_20->_vptr_Layer[2])(local_20,auStack_938 + 0x18);
    local_1dd0 = &local_978;
    do {
      Mat(local_1dd0);
      local_1dd0 = local_1dd0 + 1;
    } while (local_1dd0 != (Mat *)auStack_938);
    Mat(in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0bc,(size_t)in_stack_ffffffffffffe0b0,
        (Allocator *)in_stack_ffffffffffffe0a8);
    operator=((Mat *)CONCAT44(in_stack_ffffffffffffe0bc,in_stack_ffffffffffffe0b8),
              in_stack_ffffffffffffe0b0);
    ~Mat((Mat *)0x11a811);
    for (local_9bc = 0; pLVar3 = local_20, local_9bc < *(int *)(in_RDI + 0x34);
        local_9bc = local_9bc + 1) {
      fVar1 = *(float *)(local_10 + (long)local_9bc * 4);
      pfVar4 = operator[](&local_978,(long)local_9bc);
      *pfVar4 = -fVar1;
    }
    ModelBinFromMatArray::ModelBinFromMatArray
              ((ModelBinFromMatArray *)in_stack_ffffffffffffe0b0,in_stack_ffffffffffffe0a8);
    (*pLVar3->_vptr_Layer[3])(pLVar3,local_9d0);
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)0x11a9ad);
    local_1e18 = (Mat *)auStack_938;
    do {
      local_1e18 = local_1e18 + -1;
      ~Mat((Mat *)0x11a9e2);
    } while (local_1e18 != &local_978);
    ParamDict::~ParamDict((ParamDict *)in_stack_ffffffffffffe0c0);
  }
  Option::Option((Option *)in_stack_ffffffffffffe0b0);
  local_1db4 = 1;
  (*local_20->_vptr_Layer[4])(local_20,local_1db8);
  (*local_20->_vptr_Layer[9])(local_20,in_RDI,local_1db8);
  (*local_20->_vptr_Layer[5])(local_20,local_1db8);
  if (local_20 != (Layer *)0x0) {
    (*local_20->_vptr_Layer[1])();
  }
  return;
}

Assistant:

void Mat::substract_mean_normalize(const float* mean_vals, const float* norm_vals)
{
    Layer* op;

    if (mean_vals && !norm_vals)
    {
        // substract mean only
        op = create_layer(LayerType::Bias);

        ParamDict pd;
        pd.set(0, c);

        op->load_param(pd);

        Mat weights[1];
        weights[0] = Mat(c);
        for (int q=0; q<c; q++)
        {
            weights[0][q] = -mean_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else if (!mean_vals && norm_vals)
    {
        // normalize only
        op = create_layer(LayerType::Scale);

        ParamDict pd;
        pd.set(0, c);

        op->load_param(pd);

        Mat weights[1];
        weights[0] = Mat(c);
        for (int q=0; q<c; q++)
        {
            weights[0][q] = norm_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else if (mean_vals && norm_vals)
    {
        // substract mean and normalize
        op = create_layer(LayerType::Scale);

        ParamDict pd;
        pd.set(0, c);
        pd.set(1, 1);

        op->load_param(pd);

        Mat weights[2];
        weights[0] = Mat(c);
        weights[1] = Mat(c);
        for (int q=0; q<c; q++)
        {
            weights[0][q] = norm_vals[q];
            weights[1][q] = - mean_vals[q] * norm_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else // if (!mean_vals && !norm_vals)
    {
        return;
    }

    Option opt;
    opt.num_threads = 1;// TODO

    op->create_pipeline(opt);

    op->forward_inplace(*this, opt);

    op->destroy_pipeline(opt);

    delete op;
}